

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O1

void PWM_Update(void *info,UINT32 length,DEV_SMPL **buf)

{
  DEV_SMPL *pDVar1;
  DEV_SMPL *pDVar2;
  int iVar3;
  int iVar4;
  ushort uVar5;
  ulong uVar6;
  
  if (*(char *)((long)info + 0xd) != '\0') {
    memset(*buf,0,(ulong)length << 2);
    memset(buf[1],0,(ulong)length << 2);
    return;
  }
  iVar3 = 0;
  iVar4 = 0;
  if (*(ushort *)((long)info + 0x10) != 0) {
    uVar5 = *(ushort *)((long)info + 0x10) & 0xfff;
    iVar4 = ((int)(short)((ushort)(uVar5 < 0x800) * 0x1000 + uVar5 + -0x1000) -
            *(int *)((long)info + 0x14)) * *(int *)((long)info + 0x18) >> 8;
  }
  if (*(ushort *)((long)info + 0xe) != 0) {
    uVar5 = *(ushort *)((long)info + 0xe) & 0xfff;
    iVar3 = ((int)(short)((ushort)(uVar5 < 0x800) * 0x1000 + uVar5 + -0x1000) -
            *(int *)((long)info + 0x14)) * *(int *)((long)info + 0x18) >> 8;
  }
  if (length != 0) {
    pDVar1 = *buf;
    pDVar2 = buf[1];
    uVar6 = 0;
    do {
      pDVar1[uVar6] = iVar4;
      pDVar2[uVar6] = iVar3;
      uVar6 = uVar6 + 1;
    } while (length != uVar6);
  }
  return;
}

Assistant:

static void PWM_Update(void* info, UINT32 length, DEV_SMPL **buf)
{
	pwm_chip* chip = (pwm_chip*)info;
	DEV_SMPL tmpOutL;
	DEV_SMPL tmpOutR;
	UINT32 i;
	
	if (chip->PWM_Mute)
	{
		memset(buf[0], 0, length * sizeof(DEV_SMPL));
		memset(buf[1], 0, length * sizeof(DEV_SMPL));
		return;
	}
	
	// New PWM scaling algorithm provided by Chilly Willy on the Sonic Retro forums.
	tmpOutL = PWM_Update_Scale(chip, (INT16)chip->PWM_Out_L);
	tmpOutR = PWM_Update_Scale(chip, (INT16)chip->PWM_Out_R);
	
	for (i = 0; i < length; i ++)
	{
		buf[0][i] = tmpOutL;
		buf[1][i] = tmpOutR;
	}
	
	return;
}